

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_dev.cpp
# Opt level: O2

bool ReadBlockDevice(string *path,shared_ptr<Disk> *disk)

{
  element_type *this;
  bool bVar1;
  bool bVar2;
  exception *this_00;
  __single_object blockdev;
  shared_ptr<BlockFloppyDisk> blk_dev_disk;
  Format local_68;
  CylHead local_28;
  
  bVar1 = IsBlockDevice(path);
  if (bVar1) {
    std::make_unique<BlockDevice>();
    bVar1 = BlockDevice::Open((BlockDevice *)
                              blockdev._M_t.
                              super___uniq_ptr_impl<BlockDevice,_std::default_delete<BlockDevice>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_BlockDevice_*,_std::default_delete<BlockDevice>_>
                              .super__Head_base<0UL,_BlockDevice_*,_false>._M_head_impl,path,true);
    if (bVar1) {
      local_68.cyls = 0x50;
      local_68.heads = 2;
      local_68.fdc = PC;
      local_68.datarate = Unknown;
      local_68.encoding = Unknown;
      local_68.sectors = 0;
      local_68.size = 2;
      local_68.base = 1;
      local_68.offset = 0;
      local_68.interleave = 1;
      local_68.skew._0_2_ = 0;
      local_68._42_6_ = 0;
      local_68.head1._0_2_ = 1;
      local_68._50_6_ = 0;
      local_68.fill = '\0';
      local_68.cyls_first = false;
      bVar2 = Format::FromSize(*(int64_t *)
                                ((long)blockdev._M_t.
                                       super___uniq_ptr_impl<BlockDevice,_std::default_delete<BlockDevice>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_BlockDevice_*,_std::default_delete<BlockDevice>_>
                                       .super__Head_base<0UL,_BlockDevice_*,_false>._M_head_impl +
                                0x28),&local_68);
      if (!bVar2) {
        this_00 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[20]>(this_00,(char (*) [20])"not a floppy device");
LAB_0017f3ff:
        __cxa_throw(this_00,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_68.sectors < opt.sectors) {
        this_00 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[25],int&>
                  (this_00,(char (*) [25])"sector count must be <= ",&local_68.sectors);
        goto LAB_0017f3ff;
      }
      if (0 < opt.sectors) {
        local_68.sectors = (int)opt.sectors;
      }
      std::
      make_shared<BlockFloppyDisk,std::unique_ptr<BlockDevice,std::default_delete<BlockDevice>>>
                ((unique_ptr<BlockDevice,_std::default_delete<BlockDevice>_> *)&blk_dev_disk);
      this = blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      CylHead::CylHead(&local_28,local_68.cyls + -1,local_68.heads + -1);
      DemandDisk::extend(&this->super_DemandDisk,&local_28);
      *(ulong *)((long)&((blk_dev_disk.
                          super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        super_DemandDisk).super_Disk.fmt.skew + 2) =
           CONCAT26((undefined2)local_68.head1,local_68._42_6_);
      *(ulong *)((long)&((blk_dev_disk.
                          super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        super_DemandDisk).super_Disk.fmt.head1 + 2) =
           CONCAT26(local_68._56_2_,local_68._50_6_);
      ((blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_DemandDisk).super_Disk.fmt.offset = local_68.offset;
      ((blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_DemandDisk).super_Disk.fmt.interleave = local_68.interleave;
      ((blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_DemandDisk).super_Disk.fmt.skew =
           (int)CONCAT62(local_68._42_6_,(undefined2)local_68.skew);
      ((blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_DemandDisk).super_Disk.fmt.head0 = local_68.head0;
      ((blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_DemandDisk).super_Disk.fmt.encoding = local_68.encoding;
      ((blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_DemandDisk).super_Disk.fmt.sectors = local_68.sectors;
      ((blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_DemandDisk).super_Disk.fmt.size = local_68.size;
      ((blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_DemandDisk).super_Disk.fmt.base = local_68.base;
      ((blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_DemandDisk).super_Disk.fmt.cyls = local_68.cyls;
      ((blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_DemandDisk).super_Disk.fmt.heads = local_68.heads;
      ((blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_DemandDisk).super_Disk.fmt.fdc = local_68.fdc;
      ((blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_DemandDisk).super_Disk.fmt.datarate = local_68.datarate;
      std::__cxx11::string::assign
                ((char *)&((blk_dev_disk.
                            super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->super_DemandDisk).super_Disk.strType);
      std::__shared_ptr<Disk,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Disk,(__gnu_cxx::_Lock_policy)2> *)disk,
                 &blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&blk_dev_disk.super___shared_ptr<BlockFloppyDisk,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::unique_ptr<BlockDevice,_std::default_delete<BlockDevice>_>::~unique_ptr(&blockdev);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ReadBlockDevice(const std::string& path, std::shared_ptr<Disk>& disk)
{
    if (!IsBlockDevice(path))
        return false;

    auto blockdev = std::make_unique<BlockDevice>();
    if (!blockdev->Open(path, true))
        return false;

    Format fmt;
    if (!Format::FromSize(blockdev->total_bytes, fmt))
        throw util::exception("not a floppy device");

    // Allow subsets of the track format
    if (opt.sectors > fmt.sectors)
        throw util::exception("sector count must be <= ", fmt.sectors);
    else if (opt.sectors > 0)
        fmt.sectors = opt.sectors;

    auto blk_dev_disk = std::make_shared<BlockFloppyDisk>(std::move(blockdev));
    blk_dev_disk->extend(CylHead(fmt.cyls - 1, fmt.heads - 1));
    blk_dev_disk->fmt = fmt;

    blk_dev_disk->strType = "Block Floppy Device";
    disk = blk_dev_disk;

    return true;
}